

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_nnquant.c
# Opt level: O1

uint inxsearch(nn_quant *nnq,int al,int b,int g,int r)

{
  nq_pixel *paiVar1;
  int iVar2;
  bool bVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ulong uVar9;
  int iVar10;
  bool bVar11;
  
  iVar8 = nnq->netindex[g];
  iVar2 = nnq->netsize;
  bVar3 = iVar8 < iVar2;
  bVar11 = 0 < iVar8;
  uVar4 = 0;
  if (bVar3 || bVar11) {
    uVar9 = (ulong)(iVar8 - 1);
    iVar5 = 1000;
    uVar4 = 0;
    do {
      iVar6 = iVar8;
      if (bVar3) {
        iVar7 = nnq->network[iVar8][2] - g;
        iVar6 = iVar2;
        if (iVar7 < iVar5) {
          paiVar1 = nnq->network + iVar8;
          iVar6 = -iVar7;
          if (0 < iVar7) {
            iVar6 = iVar7;
          }
          iVar10 = (*paiVar1)[1] - b;
          iVar7 = -iVar10;
          if (0 < iVar10) {
            iVar7 = iVar10;
          }
          iVar7 = iVar7 + iVar6;
          if (iVar7 < iVar5) {
            iVar10 = (*paiVar1)[3] - r;
            iVar6 = -iVar10;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            iVar7 = iVar7 + iVar6;
          }
          if (iVar7 < iVar5) {
            iVar10 = (*paiVar1)[0] - al;
            iVar6 = -iVar10;
            if (0 < iVar10) {
              iVar6 = iVar10;
            }
            iVar7 = iVar7 + iVar6;
          }
          iVar6 = iVar8 + 1;
          if (iVar7 < iVar5) {
            uVar4 = (*paiVar1)[4];
            iVar5 = iVar7;
          }
        }
      }
      iVar8 = iVar6;
      if (bVar11) {
        iVar6 = g - nnq->network[uVar9][2];
        if (iVar6 < iVar5) {
          paiVar1 = nnq->network + uVar9;
          iVar7 = -iVar6;
          if (0 < iVar6) {
            iVar7 = iVar6;
          }
          iVar10 = (*paiVar1)[1] - b;
          iVar6 = -iVar10;
          if (0 < iVar10) {
            iVar6 = iVar10;
          }
          iVar6 = iVar6 + iVar7;
          if (iVar6 < iVar5) {
            iVar10 = (*paiVar1)[3] - r;
            iVar7 = -iVar10;
            if (0 < iVar10) {
              iVar7 = iVar10;
            }
            iVar6 = iVar6 + iVar7;
          }
          if (iVar6 < iVar5) {
            iVar10 = (*paiVar1)[0] - al;
            iVar7 = -iVar10;
            if (0 < iVar10) {
              iVar7 = iVar10;
            }
            iVar6 = iVar6 + iVar7;
          }
          uVar9 = (ulong)((int)uVar9 - 1);
          if (iVar6 < iVar5) {
            uVar4 = (*paiVar1)[4];
            iVar5 = iVar6;
          }
        }
        else {
          uVar9 = 0xffffffff;
        }
      }
      bVar3 = iVar8 < iVar2;
      bVar11 = -1 < (int)uVar9;
    } while (bVar3 || bVar11);
  }
  return uVar4;
}

Assistant:

unsigned int inxsearch(nnq, al,b,g,r)
nn_quant *nnq;
register int al, b, g, r;
{
	register int i, j, dist, a, bestd;
	register int *p;
	unsigned int best;

	bestd = 1000;		/* biggest possible dist is 256*3 */
	best = 0;
	i = nnq->netindex[g];	/* index on g */
	j = i-1;		/* start at netindex[g] and work outwards */

	while ((i<nnq->netsize) || (j>=0)) {
		if (i< nnq->netsize) {
			p = nnq->network[i];
			dist = p[2] - g;		/* inx key */
			if (dist >= bestd) i = nnq->netsize;	/* stop iter */
			else {
				i++;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}

		if (j>=0) {
			p = nnq->network[j];
			dist = g - p[2]; /* inx key - reverse dif */
			if (dist >= bestd) j = -1; /* stop iter */
			else {
				j--;
				if (dist<0) dist = -dist;
				a = p[1] - b;
				if (a<0) a = -a;
				dist += a;
				if (dist<bestd) {
					a = p[3] - r;
					if (a<0) a = -a;
					dist += a;
				}
				if(dist<bestd) {
					a = p[0] - al;
					if (a<0) a = -a;
					dist += a;
				}
				if (dist<bestd) {
					bestd=dist;
					best=p[4];
				}
			}
		}
	}

	return(best);
}